

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::SectionEntry::~SectionEntry(SectionEntry *this)

{
  SectionEntry *this_local;
  
  (this->super_DirEntry)._vptr_DirEntry = (_func_int **)&PTR__SectionEntry_0019c248;
  nameinfo::~nameinfo(&this->_name);
  DirEntry::~DirEntry(&this->super_DirEntry);
  return;
}

Assistant:

virtual ~SectionEntry() { }